

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::read_content
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  byte bVar1;
  iterator res_00;
  bool bVar2;
  long lVar3;
  string local_f8;
  string *local_d8;
  string *content_type;
  anon_class_8_1_ba1d3da0 local_c0;
  ContentReceiver local_b8;
  anon_class_16_2_4418a647 local_98;
  MultipartContentHeader local_88;
  anon_class_8_1_ba1d73fe local_68;
  ContentReceiver local_60;
  byte local_39;
  bool ret;
  iterator cur;
  Response *res_local;
  Request *req_local;
  bool last_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  cur._M_node = (_Base_ptr)res;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::MultipartFormData>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::MultipartFormData>_>
                       *)&stack0xffffffffffffffc8);
  res_00._M_node = cur._M_node;
  local_68.req = req;
  std::function<bool(char_const*,unsigned_long)>::
  function<httplib::Server::read_content(httplib::Stream&,bool,httplib::Request&,httplib::Response&)::_lambda(char_const*,unsigned_long)_1_,void>
            ((function<bool(char_const*,unsigned_long)> *)&local_60,&local_68);
  local_98.cur = (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::MultipartFormData>_>
                  *)&stack0xffffffffffffffc8;
  local_98.req = req;
  std::function<bool(httplib::MultipartFormData_const&)>::
  function<httplib::Server::read_content(httplib::Stream&,bool,httplib::Request&,httplib::Response&)::_lambda(httplib::MultipartFormData_const&)_1_,void>
            ((function<bool(httplib::MultipartFormData_const&)> *)&local_88,&local_98);
  local_c0.cur = (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::MultipartFormData>_>
                  *)&stack0xffffffffffffffc8;
  std::function<bool(char_const*,unsigned_long)>::
  function<httplib::Server::read_content(httplib::Stream&,bool,httplib::Request&,httplib::Response&)::_lambda(char_const*,unsigned_long)_2_,void>
            ((function<bool(char_const*,unsigned_long)> *)&local_b8,&local_c0);
  bVar2 = read_content_core(this,strm,last_connection,req,(Response *)res_00._M_node,&local_60,
                            &local_88,&local_b8);
  std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_b8);
  std::function<bool_(const_httplib::MultipartFormData_&)>::~function(&local_88);
  std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_60);
  local_39 = bVar2;
  Request::get_header_value_abi_cxx11_(&local_f8,req,"Content-Type",0);
  local_d8 = &local_f8;
  lVar3 = std::__cxx11::string::find((char *)local_d8,0x181016);
  if (lVar3 == 0) {
    detail::parse_query_text(&req->body,&req->params);
  }
  bVar1 = local_39;
  std::__cxx11::string::~string((string *)&local_f8);
  return (bool)(bVar1 & 1);
}

Assistant:

inline bool Server::read_content(Stream &strm, bool last_connection,
                                 Request &req, Response &res) {
  MultipartFormDataMap::iterator cur;
  auto ret = read_content_core(
      strm, last_connection, req, res,
      // Regular
      [&](const char *buf, size_t n) {
        if (req.body.size() + n > req.body.max_size()) { return false; }
        req.body.append(buf, n);
        return true;
      },
      // Multipart
      [&](const MultipartFormData &file) {
        cur = req.files.emplace(file.name, file);
        return true;
      },
      [&](const char *buf, size_t n) {
        auto &content = cur->second.content;
        if (content.size() + n > content.max_size()) { return false; }
        content.append(buf, n);
        return true;
      });

  const auto &content_type = req.get_header_value("Content-Type");
  if (!content_type.find("application/x-www-form-urlencoded")) {
    detail::parse_query_text(req.body, req.params);
  }

  return ret;
}